

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O3

void __thiscall
FillCellHelper::insertDecoration(FillCellHelper *this,ReportBuilder *builder,QTextDocument *textDoc)

{
  qsizetype qVar1;
  bool bVar2;
  char cVar3;
  QMetaType QVar4;
  QImage *pQVar5;
  PrivateShared *pPVar6;
  PrivateShared *pPVar7;
  QIcon t_1;
  QImage img;
  QString name;
  QMetaType in_stack_ffffffffffffff58;
  QIcon in_stack_ffffffffffffff60;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QImage local_78 [16];
  qsizetype local_68;
  QArrayDataPointer<char16_t> local_60;
  undefined1 local_48 [32];
  
  pPVar7 = (PrivateShared *)&this->cellDecoration;
  bVar2 = operator==((QMetaType)in_stack_ffffffffffffff60.d,in_stack_ffffffffffffff58);
  if (bVar2) {
    pQVar5 = (QImage *)pPVar7;
    if (((this->cellDecoration).d.field_0x18 & 1) != 0) {
      pPVar6 = (((QVariant *)pPVar7)->d).data.shared;
      pQVar5 = (QImage *)(pPVar6 + *(int *)(pPVar6 + 4));
    }
    QImage::QImage(local_78,pQVar5);
  }
  else {
    QImage::QImage(local_78);
    QVar4.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar6 = pPVar7;
    if (((this->cellDecoration).d.field_0x18 & 1) != 0) {
      pPVar6 = (((QVariant *)pPVar7)->d).data.shared;
      pPVar6 = pPVar6 + *(int *)(pPVar6 + 4);
    }
    QMetaType::convert(QVar4,pPVar6,(QMetaType)0x175f30,local_78);
  }
  cVar3 = QImage::isNull();
  if (cVar3 != '\0') {
    bVar2 = operator==((QMetaType)in_stack_ffffffffffffff60.d,in_stack_ffffffffffffff58);
    if (bVar2) {
      if (((this->cellDecoration).d.field_0x18 & 1) != 0) {
        pPVar7 = (((QVariant *)pPVar7)->d).data.shared;
        pPVar7 = pPVar7 + *(int *)(pPVar7 + 4);
      }
      QIcon::QIcon((QIcon *)&stack0xffffffffffffff60,(QIcon *)pPVar7);
    }
    else {
      QIcon::QIcon((QIcon *)&stack0xffffffffffffff60);
      QVar4.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((this->cellDecoration).d.field_0x18 & 1) != 0) {
        pPVar7 = (((QVariant *)pPVar7)->d).data.shared;
        pPVar7 = pPVar7 + *(int *)(pPVar7 + 4);
      }
      QMetaType::convert(QVar4,pPVar7,(QMetaType)0x175fa0,&stack0xffffffffffffff60);
    }
    QIcon::pixmap((QSize *)&local_98.shared,(Mode)&stack0xffffffffffffff60,(State)this);
    QPixmap::toImage();
    QPaintDevice::QPaintDevice((QPaintDevice *)local_48);
    qVar1 = local_60.size;
    local_48._16_8_ = local_68;
    local_48._0_8_ = QTextCursor::blockFormat;
    local_60.size = 0;
    local_68 = qVar1;
    QImage::~QImage((QImage *)local_48);
    QImage::~QImage((QImage *)&local_60);
    QPixmap::~QPixmap((QPixmap *)local_98.data);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffff60);
  }
  cVar3 = QImage::isNull();
  if (cVar3 == '\0') {
    local_48._0_8_ = (PrivateShared *)0x0;
    local_48._8_8_ = L"cell-image%1.png";
    local_48._16_8_ = 0x10;
    local_98.shared = (PrivateShared *)0x0;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    insertDecoration::imageNumber = insertDecoration::imageNumber + 1;
    QString::arg((longlong)&local_60,(int)local_48,insertDecoration::imageNumber,(QChar)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QUrl::QUrl((QUrl *)&local_98.shared,(QString *)&local_60,TolerantMode);
    QImage::operator_cast_to_QVariant((QVariant *)local_48,local_78);
    QTextDocument::addResource((int)textDoc,(QUrl *)0x2,(QVariant *)&local_98);
    QVariant::~QVariant((QVariant *)local_48);
    QUrl::~QUrl((QUrl *)&local_98.shared);
    KDReports::TextDocumentData::addResourceName(builder->m_contentDocument,(QString *)&local_60);
    QTextCursor::insertImage((QString *)&this->cellCursor);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  QImage::~QImage(local_78);
  return;
}

Assistant:

void FillCellHelper::insertDecoration(KDReports::ReportBuilder &builder, QTextDocument &textDoc)
{
    QImage img = qvariant_cast<QImage>(cellDecoration);
    if (img.isNull()) {
        img = qvariant_cast<QIcon>(cellDecoration).pixmap(iconSize).toImage();
    }
    if (!img.isNull()) {
        static int imageNumber = 0;
        const QString name = QStringLiteral("cell-image%1.png").arg(++imageNumber);
        textDoc.addResource(QTextDocument::ImageResource, QUrl(name), img);
        builder.currentDocumentData().addResourceName(name);
        cellCursor.insertImage(name);
    }
}